

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseValueExpression(Parser *this)

{
  shared_ptr<minja::Expression> *psVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Parser *in_RSI;
  long lVar7;
  shared_ptr<minja::Expression> sVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator_type local_d9;
  shared_ptr<minja::Expression> index;
  shared_ptr<minja::Expression> slice_start;
  allocator_type local_b1;
  CharIterator local_b0;
  Location location;
  shared_ptr<minja::Expression> slice_end;
  string local_68 [48];
  anon_class_8_1_8991fb9c parseValue;
  
  parseValueExpression::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
  local_b0._M_current = (char *)this;
  while ((in_RSI->it)._M_current != (in_RSI->end)._M_current) {
    bVar3 = consumeSpaces(in_RSI,Strip);
    if (!bVar3) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&slice_end,"[",(allocator<char> *)&index);
    std::__cxx11::string::string<std::allocator<char>>(local_68,".",(allocator<char> *)&slice_start)
    ;
    __l._M_len = 2;
    __l._M_array = (iterator)&slice_end;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&location,__l,&local_d9);
    bVar3 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&location);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&location);
    lVar7 = 0x20;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar7));
      this = (Parser *)local_b0._M_current;
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    if (!bVar3) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"[",(allocator<char> *)&index);
    consumeToken((string *)&slice_end,in_RSI,(string *)&location,Strip);
    _Var6 = slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::~string((string *)&slice_end);
    std::__cxx11::string::~string((string *)&location);
    if (_Var6._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location,".",(allocator<char> *)&index);
      consumeToken((string *)&slice_end,in_RSI,(string *)&location,Strip);
      _Var6 = slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      std::__cxx11::string::~string((string *)&slice_end);
      std::__cxx11::string::~string((string *)&location);
      if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        parseIdentifier((Parser *)&index);
        if (index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected identifier in subscript");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        consumeSpaces(in_RSI,Strip);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&slice_end,"(",(allocator<char> *)&slice_start);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&slice_end;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&location,__l_00,&local_d9);
        bVar3 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&location);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&location);
        std::__cxx11::string::~string((string *)&slice_end);
        peVar2 = index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (!bVar3) {
          std::__cxx11::string::string
                    ((string *)&location,
                     (string *)
                     (index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     + 1));
          Value::Value((Value *)&slice_end,(string *)&location);
          std::make_shared<minja::LiteralExpr,minja::Location&,minja::Value>
                    ((Location *)&slice_start,(Value *)&peVar2->location);
          Value::~Value((Value *)&slice_end);
          std::__cxx11::string::~string((string *)&location);
          std::
          make_shared<minja::SubscriptExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::LiteralExpr>>
                    ((Location *)&slice_end,
                     (shared_ptr<minja::Expression> *)
                     &(index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->location,(shared_ptr<minja::LiteralExpr> *)this);
          std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
                     (__shared_ptr<minja::SubscriptExpr,_(__gnu_cxx::_Lock_policy)2> *)&slice_end);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar1 = &slice_start;
          goto LAB_001a84ed;
        }
        parseCallArgs((ArgumentsExpression *)&slice_end,in_RSI);
        std::
        make_shared<minja::MethodCallExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::VariableExpr>,minja::ArgumentsExpression>
                  (&location,
                   (shared_ptr<minja::Expression> *)
                   &(index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->location,(shared_ptr<minja::VariableExpr> *)this,(ArgumentsExpression *)&index
                  );
        std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<minja::MethodCallExpr,_(__gnu_cxx::_Lock_policy)2> *)&location);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        ArgumentsExpression::~ArgumentsExpression((ArgumentsExpression *)&slice_end);
        goto LAB_001a84f2;
      }
    }
    else {
      index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location,":",(allocator<char> *)&slice_start);
      consumeToken((string *)&slice_end,in_RSI,(string *)&location,Strip);
      _Var6 = slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      std::__cxx11::string::~string((string *)&slice_end);
      std::__cxx11::string::~string((string *)&location);
      bVar3 = SUB81(in_RSI,0);
      if (_Var6._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        parseExpression((Parser *)&slice_start,bVar3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&location,":",(allocator<char> *)&local_d9);
        consumeToken((string *)&slice_end,in_RSI,(string *)&location,Strip);
        _Var6 = slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        std::__cxx11::string::~string((string *)&slice_end);
        std::__cxx11::string::~string((string *)&location);
        if (_Var6._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>,
                     &slice_start.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)
          ;
        }
        else {
          consumeSpaces(in_RSI,Strip);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&slice_end,"]",(allocator<char> *)&local_d9);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&slice_end;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&location,__l_01,&local_b1);
          bVar4 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&location);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&location);
          std::__cxx11::string::~string((string *)&slice_end);
          if (bVar4) {
            location.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            std::
            make_shared<minja::SliceExpr,minja::Location&,std::shared_ptr<minja::Expression>,decltype(nullptr)>
                      ((Location *)&slice_end,
                       (shared_ptr<minja::Expression> *)
                       &(slice_start.
                         super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        location,(void **)&slice_start);
            std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)&index,
                       (__shared_ptr<minja::SliceExpr,_(__gnu_cxx::_Lock_policy)2> *)&slice_end);
          }
          else {
            parseExpression((Parser *)&slice_end,bVar3);
            std::
            make_shared<minja::SliceExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                      (&location,
                       (shared_ptr<minja::Expression> *)
                       &(slice_start.
                         super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        location,&slice_start);
            std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)&index,
                       (__shared_ptr<minja::SliceExpr,_(__gnu_cxx::_Lock_policy)2> *)&location);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&location.source.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        psVar1 = &slice_start;
      }
      else {
        parseExpression((Parser *)&slice_end,bVar3);
        slice_start.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::
        make_shared<minja::SliceExpr,minja::Location&,decltype(nullptr),std::shared_ptr<minja::Expression>>
                  (&location,
                   (void **)&(slice_end.
                              super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->location,&slice_start);
        std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)&index,
                   (__shared_ptr<minja::SliceExpr,_(__gnu_cxx::_Lock_policy)2> *)&location);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        psVar1 = &slice_end;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(psVar1->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      if (index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Empty index in subscript");
LAB_001a8607:
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location,"]",(allocator<char> *)&slice_start);
      consumeToken((string *)&slice_end,in_RSI,(string *)&location,Strip);
      _Var6 = slice_end.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      std::__cxx11::string::~string((string *)&slice_end);
      std::__cxx11::string::~string((string *)&location);
      if (_Var6._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected closing bracket in subscript");
        goto LAB_001a8607;
      }
      std::
      make_shared<minja::SubscriptExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                ((Location *)&slice_end,(shared_ptr<minja::Expression> *)(*(long *)this + 8),
                 (shared_ptr<minja::Expression> *)this);
      std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<minja::SubscriptExpr,_(__gnu_cxx::_Lock_policy)2> *)&slice_end);
      psVar1 = &slice_end;
LAB_001a84ed:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(psVar1->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
LAB_001a84f2:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    consumeSpaces(in_RSI,Strip);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&slice_end,"(",(allocator<char> *)&index);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&slice_end;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&location,__l_02,(allocator_type *)&slice_start);
  bVar3 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&location);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&location);
  std::__cxx11::string::~string((string *)&slice_end);
  _Var6._M_pi = extraout_RDX;
  if (bVar3) {
    get_location(&location,in_RSI);
    parseCallArgs((ArgumentsExpression *)&slice_end,in_RSI);
    std::
    make_shared<minja::CallExpr,minja::Location&,std::shared_ptr<minja::Expression>,minja::ArgumentsExpression>
              ((Location *)&index,(shared_ptr<minja::Expression> *)&location,
               (ArgumentsExpression *)this);
    std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<minja::CallExpr,_(__gnu_cxx::_Lock_policy)2> *)&index);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&index.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    ArgumentsExpression::~ArgumentsExpression((ArgumentsExpression *)&slice_end);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar8.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar8.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseValueExpression() {
      auto parseValue = [&]() -> std::shared_ptr<Expression> {
        auto location = get_location();
        auto constant = parseConstant();
        if (constant) return std::make_shared<LiteralExpr>(location, *constant);

        static std::regex null_regex(R"(null\b)");
        if (!consumeToken(null_regex).empty()) return std::make_shared<LiteralExpr>(location, Value());

        auto identifier = parseIdentifier();
        if (identifier) return identifier;

        auto braced = parseBracedExpressionOrArray();
        if (braced) return braced;

        auto array = parseArray();
        if (array) return array;

        auto dictionary = parseDictionary();
        if (dictionary) return dictionary;

        throw std::runtime_error("Expected value expression");
      };

      auto value = parseValue();

      while (it != end && consumeSpaces() && peekSymbols({ "[", "." })) {
        if (!consumeToken("[").empty()) {
            std::shared_ptr<Expression> index;
            if (!consumeToken(":").empty()) {
              auto slice_end = parseExpression();
              index = std::make_shared<SliceExpr>(slice_end->location, nullptr, std::move(slice_end));
            } else {
              auto slice_start = parseExpression();
              if (!consumeToken(":").empty()) {
                consumeSpaces();
                if (peekSymbols({ "]" })) {
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), nullptr);
                } else {
                  auto slice_end = parseExpression();
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), std::move(slice_end));
                }
              } else {
                index = std::move(slice_start);
              }
            }
            if (!index) throw std::runtime_error("Empty index in subscript");
            if (consumeToken("]").empty()) throw std::runtime_error("Expected closing bracket in subscript");

            value = std::make_shared<SubscriptExpr>(value->location, std::move(value), std::move(index));
        } else if (!consumeToken(".").empty()) {
            auto identifier = parseIdentifier();
            if (!identifier) throw std::runtime_error("Expected identifier in subscript");

            consumeSpaces();
            if (peekSymbols({ "(" })) {
              auto callParams = parseCallArgs();
              value = std::make_shared<MethodCallExpr>(identifier->location, std::move(value), std::move(identifier), std::move(callParams));
            } else {
              auto key = std::make_shared<LiteralExpr>(identifier->location, Value(identifier->get_name()));
              value = std::make_shared<SubscriptExpr>(identifier->location, std::move(value), std::move(key));
            }
        }
        consumeSpaces();
      }

      if (peekSymbols({ "(" })) {
        auto location = get_location();
        auto callParams = parseCallArgs();
        value = std::make_shared<CallExpr>(location, std::move(value), std::move(callParams));
      }
      return value;
    }